

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

TemplateString * __thiscall
ctemplate::TemplateDictionary::Memdup
          (TemplateString *__return_storage_ptr__,TemplateDictionary *this,char *s,size_t slen)

{
  char *__dest;
  
  __dest = (char *)BaseArena::GetMemory(&this->arena_->super_BaseArena,slen + 1,1);
  memcpy(__dest,s,slen);
  __dest[slen] = '\0';
  __return_storage_ptr__->ptr_ = __dest;
  __return_storage_ptr__->length_ = slen;
  __return_storage_ptr__->is_immutable_ = false;
  __return_storage_ptr__->id_ = 0;
  return __return_storage_ptr__;
}

Assistant:

TemplateString TemplateDictionary::Memdup(const char* s, size_t slen) {
  return TemplateString(arena_->MemdupPlusNUL(s, slen), slen);  // add a \0 too
}